

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextNewFrameUpdateDocking(ImGuiContext *ctx)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiDockNode *pIVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiStoragePair *pIVar5;
  ImGuiDockNode *node;
  int n_1;
  int n;
  ImGuiWindow *hovered_window;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiContext *ctx_local;
  
  if (((ctx->IO).ConfigFlags & 0x40U) != 0) {
    ctx->HoveredDockNode = (ImGuiDockNode *)0x0;
    pIVar1 = ctx->HoveredWindowUnderMovingWindow;
    if (pIVar1 != (ImGuiWindow *)0x0) {
      if (pIVar1->DockNodeAsHost == (ImGuiDockNode *)0x0) {
        if (pIVar1->RootWindow->DockNode != (ImGuiDockNode *)0x0) {
          ctx->HoveredDockNode = pIVar1->RootWindow->DockNode;
        }
      }
      else {
        pIVar3 = DockNodeTreeFindVisibleNodeByPos(pIVar1->DockNodeAsHost,(ctx->IO).MousePos);
        ctx->HoveredDockNode = pIVar3;
      }
    }
    for (node._4_4_ = 0; node._4_4_ < (ctx->DockContext).Requests.Size; node._4_4_ = node._4_4_ + 1)
    {
      pIVar4 = ImVector<ImGuiDockRequest>::operator[](&(ctx->DockContext).Requests,node._4_4_);
      if (pIVar4->Type == ImGuiDockRequestType_Dock) {
        pIVar4 = ImVector<ImGuiDockRequest>::operator[](&(ctx->DockContext).Requests,node._4_4_);
        DockContextProcessDock(ctx,pIVar4);
      }
    }
    ImVector<ImGuiDockRequest>::resize(&(ctx->DockContext).Requests,0);
    for (node._0_4_ = 0; (int)node < (ctx->DockContext).Nodes.Data.Size; node._0_4_ = (int)node + 1)
    {
      pIVar5 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                         ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,(int)node);
      pIVar3 = (ImGuiDockNode *)(pIVar5->field_1).val_p;
      if ((pIVar3 != (ImGuiDockNode *)0x0) && (bVar2 = ImGuiDockNode::IsFloatingNode(pIVar3), bVar2)
         ) {
        DockNodeUpdate(pIVar3);
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockContextNewFrameUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // [DEBUG] Store hovered dock node.
    // We could in theory use DockNodeTreeFindVisibleNodeByPos() on the root host dock node, but using ->DockNode is a good shortcut.
    // Note this is mostly a debug thing and isn't actually used for docking target, because docking involve more detailed filtering.
    g.HoveredDockNode = NULL;
    if (ImGuiWindow* hovered_window = g.HoveredWindowUnderMovingWindow)
    {
        if (hovered_window->DockNodeAsHost)
            g.HoveredDockNode = DockNodeTreeFindVisibleNodeByPos(hovered_window->DockNodeAsHost, g.IO.MousePos);
        else if (hovered_window->RootWindow->DockNode)
            g.HoveredDockNode = hovered_window->RootWindow->DockNode;
    }

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}